

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_light_calib.cpp
# Opt level: O1

void crossPoint(structure_light *a,
               vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               *crossPoint)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> cornerlinePoint;
  Vec4f cornerLine;
  Vec4f lightLine;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> cornerPoint;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> lightcornerPoint;
  Point2f temp;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> lightLinePoint;
  _OutputArray local_108;
  undefined8 local_e8;
  undefined8 uStack_e0;
  Point_<float> local_d8;
  undefined8 uStack_d0;
  _InputArray local_c0;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_a8;
  structure_light *local_90;
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  *local_88;
  ulong local_80;
  undefined1 local_78 [8];
  undefined1 *local_70;
  Size local_68;
  _OutputArray local_60;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_48;
  
  if (0 < imageCount) {
    uVar1 = 0;
    local_90 = a;
    local_88 = crossPoint;
    do {
      local_80 = uVar1;
      if (((a->isRecognize).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar1 >> 6] >>
           (uVar1 & 0x3f) & 1) != 0) {
        local_d8.x = 0.0;
        local_d8.y = 0.0;
        uStack_d0 = 0;
        std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                  (&local_48,
                   (a->lightPlaneSubpixelImagePoint).
                   super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar1);
        local_c0.sz.width = 0;
        local_c0.sz.height = 0;
        local_c0.flags = -0x7efcfff3;
        local_108.super__InputArray.flags = 0xc2020005;
        local_108.super__InputArray.obj = &local_d8;
        local_108.super__InputArray.sz.width = 1;
        local_108.super__InputArray.sz.height = 4;
        local_c0.obj = &local_48;
        cv::fitLine(&local_c0,&local_108,2,0.0,0.01,0.01);
        std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                  ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)&local_c0,
                   (a->calibImagePoint).
                   super__Vector_base<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar1);
        local_108.super__InputArray._0_8_ = (pointer)0x0;
        local_108.super__InputArray.obj = (pointer)0x0;
        local_108.super__InputArray.sz.width = 0;
        local_108.super__InputArray.sz.height = 0;
        local_e8 = 0;
        uStack_e0 = 0;
        local_a8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_a8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        if (0 < patternSize.width) {
          iVar2 = 0;
          do {
            if (0 < patternSize.height) {
              iVar3 = 0;
              do {
                std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
                          ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                           &local_108,
                           (value_type *)
                           ((long)(patternSize.width * iVar3 + iVar2) * 8 +
                           CONCAT44(local_c0._4_4_,local_c0.flags)));
                iVar3 = iVar3 + 1;
              } while (iVar3 < patternSize.height);
            }
            local_68.width = 0;
            local_68.height = 0;
            local_78._0_4_ = -0x7efcfff3;
            local_60.super__InputArray.flags = -0x3dfdfffb;
            local_60.super__InputArray.obj = &local_e8;
            local_60.super__InputArray.sz.width = 1;
            local_60.super__InputArray.sz.height = 4;
            local_70 = (undefined1 *)&local_108;
            cv::fitLine((_InputArray *)local_78,&local_60,2,0.0,0.01,0.01);
            fVar4 = local_e8._4_4_ / (float)local_e8;
            local_78._4_4_ = uStack_e0._4_4_ - (float)uStack_e0 * fVar4;
            local_78._0_4_ =
                 ((uStack_d0._4_4_ - (float)uStack_d0 * (local_d8.y / local_d8.x)) -
                 (float)local_78._4_4_) / (fVar4 - local_d8.y / local_d8.x);
            local_78._4_4_ = (float)local_78._0_4_ * fVar4 + (float)local_78._4_4_;
            std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
                      (&local_a8,(value_type *)local_78);
            if (local_108.super__InputArray.obj != (void *)local_108.super__InputArray._0_8_) {
              local_108.super__InputArray.obj = (void *)local_108.super__InputArray._0_8_;
            }
            iVar2 = iVar2 + 1;
          } while (iVar2 < patternSize.width);
        }
        std::
        vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
        ::push_back(local_88,&local_a8);
        a = local_90;
        if (local_a8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.
                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((pointer)local_108.super__InputArray._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_108.super__InputArray._0_8_);
        }
        if ((void *)CONCAT44(local_c0._4_4_,local_c0.flags) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_c0._4_4_,local_c0.flags));
        }
        if (local_48.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      uVar1 = local_80 + 1;
    } while ((long)uVar1 < (long)imageCount);
  }
  return;
}

Assistant:

void crossPoint(structure_light &a, vector<vector<Point2f>> &crossPoint)
{
    for (int i = 0; i < imageCount; i++)
    {
        if (a.isRecognize[i] == false)
            continue;
        Vec4f lightLine;
        vector<Point2f> lightLinePoint = a.lightPlaneSubpixelImagePoint[i];//取出第i张标定图像 的亚像素光条中心点
        fitLine(lightLinePoint, lightLine, DIST_L2, 0, 1e-2, 1e-2);//将第i张图的 光条中心点进行直线拟合
        vector<Point2f> cornerPoint = a.calibImagePoint[i];//靶标平面上圆形标记中心的点（49个）的二维坐标
        vector<Point2f> cornerlinePoint;//存储某一列的圆形标记的中心
        Vec4f cornerLine;//一列圆标记中心拟合出的直线的参数
        vector<Point2f> lightcornerPoint;//提取出的光条上的点
        //提取光条上的点，思路：取一列（或者一行）圆形标记的中心，拟合成直线，计算拟合出直线和光条的交点
        for (int m = 0; m < patternSize.width; m++)//遍历所有列7次
        {
            for (int n = 0; n < patternSize.height; n++)
            {
                cornerlinePoint.push_back(cornerPoint[n*patternSize.width + m]);//取第m列圆形标记的中心
            }
            fitLine(cornerlinePoint, cornerLine, DIST_L2, 0, 1e-2, 1e-2);//将第m列的圆心拟合成直线
            //求出第m列圆心拟合出来的直线和光条直线的交点
            double k1 = cornerLine[1] / cornerLine[0];
            double b1 = cornerLine[3] - k1*cornerLine[2];
            double k2 = lightLine[1] / lightLine[0];
            double b2 = lightLine[3] - k2*lightLine[2];
            Point2f temp;
            temp.x = (b2 - b1) / (k1 - k2);
            temp.y = k1*temp.x + b1;
            //将交点压入向量
            lightcornerPoint.push_back(temp);
            cornerlinePoint.clear();
        }
        crossPoint.push_back(lightcornerPoint);
    }
}